

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scrubbers.cpp
# Opt level: O3

Scrubber *
ApprovalTests::Scrubbers::createRegexScrubber
          (Scrubber *__return_storage_ptr__,regex *regexPattern,string *replacementText)

{
  pointer pcVar1;
  undefined1 *puVar2;
  string *psVar3;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  pcVar1 = (replacementText->_M_dataplus)._M_p;
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + replacementText->_M_string_length);
  puVar2 = local_50;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  psVar3 = (string *)operator_new(0x20);
  *(string **)psVar3 = psVar3 + 0x10;
  ::std::__cxx11::string::_M_construct<char*>(psVar3,puVar2,puVar2 + local_48);
  pcStack_60 = ::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/scrubbers/Scrubbers.cpp:47:31)>
               ::_M_invoke;
  local_68 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/scrubbers/Scrubbers.cpp:47:31)>
             ::_M_manager;
  local_78._M_unused._0_8_ = (undefined8)psVar3;
  createRegexScrubber(__return_storage_ptr__,regexPattern,(RegexReplacer *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

Scrubber createRegexScrubber(const std::regex& regexPattern,
                                     const std::string& replacementText)
        {
            return createRegexScrubber(
                regexPattern, [=](const RegexMatch&) { return replacementText; });
        }